

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::SetProperty_Internal<false>
               (Var receiver,RecyclableObject *object,bool isRoot,PropertyId propertyId,Var newValue
               ,PropertyValueInfo *info,ScriptContext *requestContext,
               PropertyOperationFlags propertyOperationFlags)

{
  Type *typeWithoutProperty;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  Type TVar8;
  ulong uVar9;
  BOOL local_54;
  Var pvStack_50;
  BOOL setAccessorResult;
  long *local_48;
  RecyclableObject *local_40;
  uint local_34;
  
  if (receiver != (Var)0x0) {
    pvStack_50 = newValue;
    local_34 = propertyId;
    bVar2 = VarIs<Js::RecyclableObject>(receiver);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      local_48 = (long *)receiver;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0xae1,"(!TaggedNumber::Is(receiver))",
                                  "!TaggedNumber::Is(receiver)");
      if (!bVar2) goto LAB_00ad106a;
      *puVar6 = 0;
      receiver = local_48;
    }
    local_54 = 0;
    local_48 = (long *)(ulong)isRoot;
    bVar2 = SetAccessorOrNonWritableProperty
                      (receiver,object,local_34,pvStack_50,info,requestContext,
                       propertyOperationFlags,isRoot,false,&local_54);
    if (bVar2) {
      return local_54;
    }
    BVar4 = IsObject(receiver);
    if (BVar4 == 0) {
      JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags,requestContext);
      return 0;
    }
    typeWithoutProperty = (object->type).ptr;
    if (isRoot) {
      uVar9 = (ulong)receiver & 0xffff000000000000;
      bVar2 = ((ulong)receiver & 0x1ffff00000000) != 0x1000000000000;
      if (bVar2 && uVar9 == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar3) goto LAB_00ad106a;
        *puVar6 = 0;
      }
      TVar8 = TypeIds_FirstNumberType;
      if ((uVar9 != 0x1000000000000) && (TVar8 = TypeIds_Number, (ulong)receiver >> 0x32 == 0)) {
        pRVar7 = UnsafeVarTo<Js::RecyclableObject>(receiver);
        if (pRVar7 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          local_40 = pRVar7;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar3) goto LAB_00ad106a;
          *puVar6 = 0;
          pRVar7 = local_40;
        }
        TVar8 = ((pRVar7->type).ptr)->typeId;
        if ((0x57 < (int)TVar8) && (BVar4 = RecyclableObject::IsExternal(pRVar7), BVar4 == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          local_40 = (RecyclableObject *)__tls_get_addr(&PTR_0155fe48);
          *(undefined4 *)
           &(local_40->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar3) goto LAB_00ad106a;
          *(undefined4 *)
           &(local_40->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject = 0;
        }
      }
      if (TVar8 != TypeIds_GlobalObject) {
        if (bVar2 && uVar9 == 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar2) goto LAB_00ad106a;
          *puVar6 = 0;
        }
        TVar8 = TypeIds_FirstNumberType;
        if ((uVar9 != 0x1000000000000) && (TVar8 = TypeIds_Number, (ulong)receiver >> 0x32 == 0)) {
          pRVar7 = UnsafeVarTo<Js::RecyclableObject>(receiver);
          if (pRVar7 == (RecyclableObject *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar6 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
            if (!bVar2) goto LAB_00ad106a;
            *puVar6 = 0;
          }
          TVar8 = ((pRVar7->type).ptr)->typeId;
          if ((0x57 < (int)TVar8) && (BVar4 = RecyclableObject::IsExternal(pRVar7), BVar4 == 0)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar6 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            if (!bVar2) goto LAB_00ad106a;
            *puVar6 = 0;
          }
        }
        if (TVar8 != TypeIds_LastTrueJavascriptObjectType) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0xafa,
                                      "(JavascriptOperators::GetTypeId(receiver) == TypeIds_GlobalObject || JavascriptOperators::GetTypeId(receiver) == TypeIds_ModuleRoot)"
                                      ,"Root must be a global object!");
          if (!bVar2) {
LAB_00ad106a:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar6 = 0;
        }
      }
      iVar5 = (**(code **)(*receiver + 0x370))
                        (receiver,local_34,pvStack_50,propertyOperationFlags,info);
    }
    else {
      pRVar7 = VarTo<Js::RecyclableObject>(receiver);
      iVar5 = 0;
      if (((pRVar7->type).ptr)->typeId != TypeIds_Null) {
        iVar5 = (*(pRVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x17])
                          (pRVar7,(ulong)local_34,pvStack_50,(ulong)propertyOperationFlags,info);
      }
    }
    if (iVar5 != 0) {
      bVar2 = VarIs<Js::JavascriptProxy>(receiver);
      if (!bVar2) {
        pRVar7 = VarTo<Js::RecyclableObject>(receiver);
        CacheOperators::CachePropertyWrite
                  (pRVar7,SUB81(local_48,0),typeWithoutProperty,local_34,info,requestContext);
        return 1;
      }
      return 1;
    }
  }
  return 0;
}

Assistant:

BOOL JavascriptOperators::SetProperty_Internal(Var receiver, RecyclableObject* object, const bool isRoot, PropertyId propertyId, Var newValue, PropertyValueInfo * info, ScriptContext* requestContext, PropertyOperationFlags propertyOperationFlags)
    {
        if (receiver == nullptr)
        {
            return FALSE;
        }

        Assert(!TaggedNumber::Is(receiver));
        BOOL setAccessorResult = FALSE;
        if (SetAccessorOrNonWritableProperty(receiver, object, propertyId, newValue, info, requestContext, propertyOperationFlags, isRoot, false, &setAccessorResult))
        {
            return setAccessorResult;
        }
        else if (!JavascriptOperators::IsObject(receiver))
        {
            JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags, requestContext);
            return FALSE;
        }

#ifdef ENABLE_MUTATION_BREAKPOINT
        // Break on mutation if needed
        bool doNotUpdateCacheForMbp = MutationBreakpoint::IsFeatureEnabled(requestContext) ?
            MutationBreakpoint::HandleSetProperty(requestContext, object, propertyId, newValue) : false;
#endif

        // Get the original type before setting the property
        Type *typeWithoutProperty = object->GetType();
        BOOL didSetProperty = false;
        if (isRoot)
        {
            AssertMsg(JavascriptOperators::GetTypeId(receiver) == TypeIds_GlobalObject
                || JavascriptOperators::GetTypeId(receiver) == TypeIds_ModuleRoot,
                "Root must be a global object!");

            RootObjectBase* rootObject = static_cast<RootObjectBase*>(receiver);
            didSetProperty = rootObject->SetRootProperty(propertyId, newValue, propertyOperationFlags, info);
        }
        else
        {
            RecyclableObject* instanceObject = VarTo<RecyclableObject>(receiver);
            while (!JavascriptOperators::IsNull(instanceObject))
            {
                if (unscopables && JavascriptOperators::IsPropertyUnscopable(instanceObject, propertyId))
                {
                    break;
                }
                else
                {
                    didSetProperty = instanceObject->SetProperty(propertyId, newValue, propertyOperationFlags, info);
                    if (didSetProperty || !unscopables)
                    {
                        break;
                    }
                }
                instanceObject = JavascriptOperators::GetPrototypeNoTrap(instanceObject);
            }
        }

        if (didSetProperty)
        {
            bool updateCache = true;
#ifdef ENABLE_MUTATION_BREAKPOINT
            updateCache = updateCache && !doNotUpdateCacheForMbp;
#endif

            if (updateCache)
            {
                if (!VarIs<JavascriptProxy>(receiver))
                {
                    CacheOperators::CachePropertyWrite(VarTo<RecyclableObject>(receiver), isRoot, typeWithoutProperty, propertyId, info, requestContext);
                }
            }
            return TRUE;
        }

        return FALSE;
    }